

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

Gia_Man_t * Ssc_PerformSweepingConstr(Gia_Man_t *p,Ssc_Pars_t *pPars)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Man_t *pAig_00;
  Gia_Man_t *pNew;
  Vec_Int_t *vOuts;
  int i;
  Gia_Man_t *pResult;
  Gia_Man_t *pCare;
  Gia_Man_t *pAig;
  Ssc_Pars_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (pPars->fVerbose != 0) {
    Abc_Print(0,"SAT sweeping AIG with %d constraints.\n",(ulong)(uint)p->nConstrs);
  }
  if (p->nConstrs == 0) {
    pCare = Gia_ManDup(p);
    iVar1 = Gia_ManCiNum(p);
    pResult = Gia_ManStart(iVar1 + 2);
    pcVar2 = Abc_UtilStrsav("care");
    pResult->pName = pcVar2;
    vOuts._4_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManCiNum(p);
      if (iVar1 <= vOuts._4_4_) break;
      Gia_ManAppendCi(pResult);
      vOuts._4_4_ = vOuts._4_4_ + 1;
    }
    Gia_ManAppendCo(pResult,0);
  }
  else {
    iVar1 = Gia_ManPoNum(p);
    p_00 = Vec_IntStartNatural(iVar1);
    piVar3 = Vec_IntArray(p_00);
    iVar1 = Gia_ManPoNum(p);
    pCare = Gia_ManDupCones(p,piVar3,iVar1 - p->nConstrs,0);
    piVar3 = Vec_IntArray(p_00);
    iVar1 = Gia_ManPoNum(p);
    pResult = Gia_ManDupCones(p,piVar3 + ((long)iVar1 - (long)p->nConstrs),p->nConstrs,0);
    Vec_IntFree(p_00);
  }
  if (pPars->fVerbose != 0) {
    printf("User AIG: ");
    Gia_ManPrintStats(pCare,(Gps_Par_t *)0x0);
    printf("Care AIG: ");
    Gia_ManPrintStats(pResult,(Gps_Par_t *)0x0);
  }
  pAig_00 = Gia_ManDupLevelized(pCare);
  Gia_ManStop(pCare);
  pNew = Ssc_PerformSweeping(pAig_00,pResult,pPars);
  if (pPars->fAppend != 0) {
    Gia_ManDupAppendShare(pNew,pResult);
    iVar1 = Gia_ManPoNum(pResult);
    pNew->nConstrs = iVar1;
  }
  Gia_ManStop(pAig_00);
  Gia_ManStop(pResult);
  return pNew;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingConstr( Gia_Man_t * p, Ssc_Pars_t * pPars )
{
    Gia_Man_t * pAig, * pCare, * pResult;
    int i;
    if ( pPars->fVerbose )
        Abc_Print( 0, "SAT sweeping AIG with %d constraints.\n", p->nConstrs );
    if ( p->nConstrs == 0 )
    {
        pAig = Gia_ManDup( p );
        pCare = Gia_ManStart( Gia_ManCiNum(p) + 2 );
        pCare->pName = Abc_UtilStrsav( "care" );
        for ( i = 0; i < Gia_ManCiNum(p); i++ )
            Gia_ManAppendCi( pCare );
        Gia_ManAppendCo( pCare, 0 );
    }
    else
    {
        Vec_Int_t * vOuts = Vec_IntStartNatural( Gia_ManPoNum(p) );
        pAig = Gia_ManDupCones( p, Vec_IntArray(vOuts), Gia_ManPoNum(p) - p->nConstrs, 0 );
        pCare = Gia_ManDupCones( p, Vec_IntArray(vOuts) + Gia_ManPoNum(p) - p->nConstrs, p->nConstrs, 0 );
        Vec_IntFree( vOuts );
    }
    if ( pPars->fVerbose )
    {
        printf( "User AIG: " );
        Gia_ManPrintStats( pAig, NULL );
        printf( "Care AIG: " );
        Gia_ManPrintStats( pCare, NULL );
    }

    pAig = Gia_ManDupLevelized( pResult = pAig );
    Gia_ManStop( pResult );
    pResult = Ssc_PerformSweeping( pAig, pCare, pPars );
    if ( pPars->fAppend )
    {
        Gia_ManDupAppendShare( pResult, pCare );
        pResult->nConstrs = Gia_ManPoNum(pCare);
    }
    Gia_ManStop( pAig );
    Gia_ManStop( pCare );
    return pResult;
}